

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void onreqvarls(uint8_t *data,uint32_t sz,i2cp_state *st,void *user)

{
  undefined8 *puVar1;
  uint16_t uVar2;
  i2p_privkeybuf *priv_00;
  uint8_t *sig;
  uint8_t *puVar3;
  uint8_t *puVar4;
  size_t sVar5;
  long in_RCX;
  long in_RDX;
  long in_RDI;
  uint8_t *ls_ptr;
  uint8_t *begin;
  uint8_t *buf;
  uint8_t numls;
  uint16_t sid;
  i2p_dest *dest;
  i2p_privkeybuf *priv;
  trans2p *t;
  undefined8 in_stack_ffffffffffffffa8;
  uint16_t big16;
  uint32_t sz_00;
  undefined5 in_stack_ffffffffffffffc0;
  byte bVar6;
  
  big16 = (uint16_t)((ulong)in_stack_ffffffffffffffa8 >> 0x30);
  priv_00 = (i2p_privkeybuf *)(in_RCX + 0x411790);
  uVar2 = bufbe16toh((void *)0x11405b);
  if (uVar2 != *(uint16_t *)(in_RDX + 2)) {
    printf("i2cp session id missmatch %d != %d\n",(ulong)uVar2,(ulong)*(ushort *)(in_RDX + 2));
  }
  bVar6 = *(byte *)(in_RDI + 2);
  sig = (uint8_t *)(in_RCX + 0x743610);
  puVar4 = sig;
  htobe16buf(sig,big16);
  puVar3 = puVar4 + 2;
  if (*(short *)(in_RCX + 0x411998) == 0) {
    puVar1 = *(undefined8 **)(in_RCX + 0x4119a8);
    *(undefined8 *)puVar3 = *puVar1;
    *(undefined8 *)(puVar4 + 10) = puVar1[1];
    *(undefined4 *)(puVar4 + 0x12) = *(undefined4 *)(puVar1 + 2);
  }
  else {
    memset(puVar3,0,0x14);
  }
  puVar3 = puVar3 + 0x14;
  memcpy(puVar3,(void *)(in_RCX + 0x4119c0),0x100);
  puVar3 = puVar3 + 0x100;
  puVar4 = puVar3;
  memcpy(puVar3,priv_00,*(size_t *)((priv_00->elg).pub + 0xbc));
  sz_00 = (uint32_t)((ulong)puVar3 >> 0x20);
  puVar4 = puVar4 + *(long *)((priv_00->elg).pub + 0xbc);
  memcpy(puVar4,(void *)(in_RCX + 0x411ac0),0x100);
  puVar1 = *(undefined8 **)((priv_00->elg).pub + 0xd4);
  *(undefined8 *)(puVar4 + 0x100) = *puVar1;
  *(undefined8 *)(puVar4 + 0x108) = puVar1[1];
  *(undefined8 *)(puVar4 + 0x110) = puVar1[2];
  *(undefined8 *)(puVar4 + 0x118) = puVar1[3];
  puVar4[0x120] = bVar6;
  puVar4 = puVar4 + 0x121;
  memcpy(puVar4,(void *)(in_RDI + 3),(long)(int)((uint)bVar6 * 0x2c));
  puVar4 = puVar4 + (int)((uint)bVar6 * 0x2c);
  i2p_dest_sign(priv_00,(uint8_t *)CONCAT26(uVar2,CONCAT15(bVar6,in_stack_ffffffffffffffc0)),
                (size_t)puVar4,sig);
  sVar5 = i2p_dest_sigsize((i2p_privkeybuf *)(in_RCX + 0x4114b6));
  i2cp_queue_send((i2cp_state *)CONCAT26(uVar2,CONCAT15(bVar6,in_stack_ffffffffffffffc0)),
                  (uint8_t)((ulong)(puVar4 + sVar5) >> 0x38),sig,sz_00);
  printf("created LS with %d leases\n",(ulong)bVar6);
  return;
}

Assistant:

void onreqvarls(uint8_t * data, uint32_t sz, struct i2cp_state * st, void * user)
{
  struct trans2p * t = user;
  struct i2p_privkeybuf * priv = &t->privkey;
  struct i2p_dest * dest = &t->ourdest;

  uint16_t sid = bufbe16toh(data);
  if(sid != st->sid)
  {
    printf("i2cp session id missmatch %d != %d\n", sid, st->sid);
  }
  
  uint8_t numls = data[2];
  
  uint8_t * buf = t->buf;
  uint8_t * begin = buf;
  // sid
  htobe16buf(buf, st->sid);
  buf += 2;
  // 20 bytes revoke
  if(t->ourdest.sigtype)
    memset(buf, 0, 20);
  else
    memcpy(buf, t->ourdest.sigkey, 20);
  
  buf += 20;
  // elg privkey
  memcpy(buf, t->lskey.priv, 256);
  buf += 256;
  // begin LS
  uint8_t * ls_ptr = buf;
  // destination
  memcpy(ls_ptr, dest->buf, dest->sz);
  buf += dest->sz;
  // LS pubkey
  memcpy(buf, t->lskey.pub, 256);
  buf += 256;
  // revoke key
  memcpy(buf, dest->sigkey, 32);
  buf += 32;
  // num leases
  *buf = numls;
  buf ++;
  // leases
  memcpy(buf, data + 3, (numls * 44));
  buf += numls * 44;
  // signature
  i2p_dest_sign(priv, ls_ptr, buf - ls_ptr, buf);
  buf += i2p_dest_sigsize(priv);
  // end
  i2cp_queue_send(st, CREATELS, begin, buf - begin);
  printf("created LS with %d leases\n", numls);
}